

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O1

FString __thiscall OPLMIDIDevice::GetStats(OPLMIDIDevice *this)

{
  byte bVar1;
  long in_RSI;
  byte *pbVar2;
  ulong uVar3;
  char star [3];
  char local_2c [4];
  
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice = (_func_int **)0x727dbc;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_2c[2] = 0x2a;
  local_2c[0] = '\x1c';
  local_2c[1] = 'A';
  if (*(int *)(*(long *)(in_RSI + 0x170) + 0x48) != 0) {
    pbVar2 = (byte *)(in_RSI + 0x18a);
    uVar3 = 0;
    do {
      bVar1 = *pbVar2;
      if ((char)bVar1 < '\0') {
        local_2c[1] = 0x41;
      }
      else if ((bVar1 & 2) == 0) {
        if ((bVar1 & 1) == 0) {
          local_2c[1] = 0x44;
        }
        else {
          local_2c[1] = 0x48;
        }
      }
      else {
        local_2c[1] = 0x49;
      }
      FString::AppendCStrPart((FString *)this,local_2c,3);
      uVar3 = uVar3 + 1;
      pbVar2 = pbVar2 + 0x28;
    } while (uVar3 < *(uint *)(*(long *)(in_RSI + 0x170) + 0x48));
  }
  return (FString)(char *)this;
}

Assistant:

FString OPLMIDIDevice::GetStats()
{
	FString out;
	char star[3] = { TEXTCOLOR_ESCAPE, 'A', '*' };
	for (uint i = 0; i < io->OPLchannels; ++i)
	{
		if (channels[i].flags & CH_FREE)
		{
			star[1] = CR_BRICK + 'A';
		}
		else if (channels[i].flags & CH_SUSTAIN)
		{
			star[1] = CR_ORANGE + 'A';
		}
		else if (channels[i].flags & CH_SECONDARY)
		{
			star[1] = CR_BLUE + 'A';
		}
		else
		{
			star[1] = CR_GREEN + 'A';
		}
		out.AppendCStrPart (star, 3);
	}
	return out;
}